

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControlPrivate::focusEvent(QWidgetTextControlPrivate *this,QFocusEvent *e)

{
  uint uVar1;
  QWidgetTextControl *this_00;
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  QRectF QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControl **)&this->field_0x8;
  QWidgetTextControl::selectionRect(&QStack_48,this_00);
  QWidgetTextControl::updateRequest(this_00,&QStack_48);
  if (*(short *)(e + 8) == 8) {
    uVar1 = (this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
            super_QFlagsStorage<Qt::TextInteractionFlag>.i;
    this->cursorOn = (uVar1 & 0x12) != 0;
    if ((uVar1 & 0x10) != 0) {
      setCursorVisible(this,true);
    }
  }
  else {
    setCursorVisible(this,false);
    this->cursorOn = false;
    if (this->cursorIsFocusIndicator == true) {
      iVar3 = QFocusEvent::reason();
      if (iVar3 != 3) {
        iVar3 = QFocusEvent::reason();
        if (iVar3 != 4) {
          cVar2 = QTextCursor::hasSelection();
          if (cVar2 != '\0') {
            QTextCursor::clearSelection();
          }
        }
      }
    }
  }
  this->hasFocus = *(short *)(e + 8) == 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::focusEvent(QFocusEvent *e)
{
    Q_Q(QWidgetTextControl);
    emit q->updateRequest(q->selectionRect());
    if (e->gotFocus()) {
#ifdef QT_KEYPAD_NAVIGATION
        if (!QApplicationPrivate::keypadNavigationEnabled() || (hasEditFocus && (e->reason() == Qt::PopupFocusReason))) {
#endif
        cursorOn = (interactionFlags & (Qt::TextSelectableByKeyboard | Qt::TextEditable));
        if (interactionFlags & Qt::TextEditable) {
            setCursorVisible(true);
        }
#ifdef QT_KEYPAD_NAVIGATION
        }
#endif
    } else {
        setCursorVisible(false);
        cursorOn = false;

        if (cursorIsFocusIndicator
            && e->reason() != Qt::ActiveWindowFocusReason
            && e->reason() != Qt::PopupFocusReason
            && cursor.hasSelection()) {
            cursor.clearSelection();
        }
    }
    hasFocus = e->gotFocus();
}